

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stage.cc
# Opt level: O0

bool tinyusdz::anon_unknown_28::FindPrimByPrimIdRec
               (uint64_t prim_id,Prim *root,Prim **primFound,int level,string *err)

{
  bool bVar1;
  uint64_t uVar2;
  vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_> *this;
  reference root_00;
  Prim *child;
  const_iterator __end2;
  const_iterator __begin2;
  vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_> *__range2;
  string *err_local;
  int level_local;
  Prim **primFound_local;
  Prim *root_local;
  uint64_t prim_id_local;
  
  if (level < 0x8000001) {
    if (primFound == (Prim **)0x0) {
      prim_id_local._7_1_ = false;
    }
    else {
      uVar2 = Prim::prim_id(root);
      if (uVar2 == prim_id) {
        *primFound = root;
        prim_id_local._7_1_ = true;
      }
      else {
        this = Prim::children(root);
        __end2._M_current =
             (Prim *)std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>::begin(this);
        child = (Prim *)std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>::end(this);
        while (bVar1 = __gnu_cxx::operator!=
                                 (&__end2,(__normal_iterator<const_tinyusdz::Prim_*,_std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>_>
                                           *)&child), bVar1) {
          root_00 = __gnu_cxx::
                    __normal_iterator<const_tinyusdz::Prim_*,_std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>_>
                    ::operator*(&__end2);
          bVar1 = FindPrimByPrimIdRec(prim_id,root_00,primFound,level + 1,err);
          if (bVar1) {
            return true;
          }
          __gnu_cxx::
          __normal_iterator<const_tinyusdz::Prim_*,_std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>_>
          ::operator++(&__end2);
        }
        prim_id_local._7_1_ = false;
      }
    }
  }
  else {
    prim_id_local._7_1_ = false;
  }
  return prim_id_local._7_1_;
}

Assistant:

bool FindPrimByPrimIdRec(uint64_t prim_id, const Prim *root,
                         const Prim **primFound, int level, std::string *err) {
  if (level > 1024 * 1024 * 128) {
    // too deep node.
    return false;
  }

  if (!primFound) {
    return false;
  }

  if (root->prim_id() == int64_t(prim_id)) {
    (*primFound) = root;
    return true;
  }

  // Brute-force search.
  for (const auto &child : root->children()) {
    if (FindPrimByPrimIdRec(prim_id, &child, primFound, level + 1, err)) {
      return true;
    }
  }

  return false;
}